

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  long lVar1;
  ZSTD_paramSwitch_e ZVar2;
  int iVar3;
  size_t sVar4;
  ZSTD_CCtx_params *in_RDI;
  ZSTD_CCtx_params *cctxParams;
  ZSTD_CCtx_params *in_stack_ffffffffffffffc8;
  ZSTD_paramSwitch_e in_stack_ffffffffffffffd0;
  ZSTD_compressionParameters *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ZSTD_compressionParameters *cParams_01;
  ZSTD_strategy ZVar5;
  undefined4 uStack_4;
  
  ZVar5 = (ZSTD_strategy)in_RDI;
  uStack_4 = (undefined4)((ulong)in_RDI >> 0x20);
  cParams_01 = (ZSTD_compressionParameters *)&stack0x00000008;
  ZSTD_CCtxParams_init(in_stack_ffffffffffffffc8,0);
  lVar1 = CONCAT44(uStack_4,ZVar5);
  *(undefined8 *)(lVar1 + 4) = *(undefined8 *)cParams_01;
  *(undefined8 *)(lVar1 + 0xc) = *(undefined8 *)&cParams_01->hashLog;
  *(undefined8 *)(lVar1 + 0x14) = *(undefined8 *)&cParams_01->minMatch;
  *(ZSTD_strategy *)(lVar1 + 0x1c) = cParams_01->strategy;
  ZVar2 = ZSTD_resolveEnableLdm(*(ZSTD_paramSwitch_e *)(lVar1 + 0x60),cParams_01);
  *(ZSTD_paramSwitch_e *)(CONCAT44(uStack_4,ZVar5) + 0x60) = ZVar2;
  if (*(int *)(CONCAT44(uStack_4,ZVar5) + 0x60) == 1) {
    ZSTD_ldm_adjustParameters
              ((ldmParams_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    if (*(uint *)(CONCAT44(uStack_4,ZVar5) + 100) < *(uint *)(CONCAT44(uStack_4,ZVar5) + 0x68)) {
      __assert_fail("cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x51fa,
                    "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
    }
    if (0x1f < *(uint *)(CONCAT44(uStack_4,ZVar5) + 0x70)) {
      __assert_fail("cctxParams.ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x51fb,
                    "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
    }
  }
  ZVar2 = ZSTD_resolveBlockSplitterMode
                    (*(ZSTD_paramSwitch_e *)(CONCAT44(uStack_4,ZVar5) + 0x8c),cParams_01);
  *(ZSTD_paramSwitch_e *)(CONCAT44(uStack_4,ZVar5) + 0x8c) = ZVar2;
  ZVar2 = ZSTD_resolveRowMatchFinderMode
                    (in_stack_ffffffffffffffd0,
                     (ZSTD_compressionParameters *)in_stack_ffffffffffffffc8);
  *(ZSTD_paramSwitch_e *)(CONCAT44(uStack_4,ZVar5) + 0x90) = ZVar2;
  iVar3 = ZSTD_resolveExternalSequenceValidation(*(int *)(CONCAT44(uStack_4,ZVar5) + 0x88));
  *(int *)(CONCAT44(uStack_4,ZVar5) + 0x88) = iVar3;
  sVar4 = ZSTD_resolveMaxBlockSize(*(size_t *)(CONCAT44(uStack_4,ZVar5) + 0xc0));
  lVar1 = CONCAT44(uStack_4,ZVar5);
  *(size_t *)(lVar1 + 0xc0) = sVar4;
  ZVar2 = ZSTD_resolveExternalRepcodeSearch
                    (*(ZSTD_paramSwitch_e *)(lVar1 + 200),*(int *)(lVar1 + 0x2c));
  *(ZSTD_paramSwitch_e *)(CONCAT44(uStack_4,ZVar5) + 200) = ZVar2;
  cParams_00.chainLog = in_stack_ffffffffffffffe4;
  cParams_00.windowLog = cParams_01->strategy;
  cParams_00._8_8_ = in_RDI;
  cParams_00._16_8_ = cParams_01;
  cParams_00.strategy = ZVar5;
  sVar4 = ZSTD_checkCParams(cParams_00);
  if (sVar4 != 0) {
    __assert_fail("!ZSTD_checkCParams(cParams)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5203,
                  "ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(ZSTD_compressionParameters)");
  }
  return in_RDI;
}

Assistant:

static ZSTD_CCtx_params ZSTD_makeCCtxParamsFromCParams(
        ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params cctxParams;
    /* should not matter, as all cParams are presumed properly defined */
    ZSTD_CCtxParams_init(&cctxParams, ZSTD_CLEVEL_DEFAULT);
    cctxParams.cParams = cParams;

    /* Adjust advanced params according to cParams */
    cctxParams.ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams.ldmParams.enableLdm, &cParams);
    if (cctxParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_ldm_adjustParameters(&cctxParams.ldmParams, &cParams);
        assert(cctxParams.ldmParams.hashLog >= cctxParams.ldmParams.bucketSizeLog);
        assert(cctxParams.ldmParams.hashRateLog < 32);
    }
    cctxParams.useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams.useBlockSplitter, &cParams);
    cctxParams.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams.useRowMatchFinder, &cParams);
    cctxParams.validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams.validateSequences);
    cctxParams.maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams.maxBlockSize);
    cctxParams.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams.searchForExternalRepcodes,
                                                                             cctxParams.compressionLevel);
    assert(!ZSTD_checkCParams(cParams));
    return cctxParams;
}